

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O3

void Abc_NtkOrderFaninsById(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  char *pcVar2;
  void *pvVar3;
  char *pSop;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *p;
  int *__ptr;
  int *__ptr_00;
  ulong uVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  uint uVar10;
  char *__s;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  char *local_68;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                  ,0x36,"void Abc_NtkOrderFaninsById(Abc_Ntk_t *)");
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  __ptr = (int *)malloc(400);
  p->pArray = __ptr;
  __ptr_00 = (int *)malloc(0x10);
  __ptr_00[0] = 100;
  __ptr_00[1] = 0;
  local_68 = (char *)malloc(100);
  *(char **)(__ptr_00 + 2) = local_68;
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar14 = 0;
    do {
      pvVar3 = pVVar8->pArray[lVar14];
      if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 7)) {
        pSop = *(char **)((long)pvVar3 + 0x38);
        uVar5 = Abc_SopGetVarNum(pSop);
        if (uVar5 != *(uint *)((long)pvVar3 + 0x1c)) {
          __assert_fail("nVars == Abc_ObjFaninNum(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                        ,0x3d,"void Abc_NtkOrderFaninsById(Abc_Ntk_t *)");
        }
        p->nSize = 0;
        if (0 < (int)uVar5) {
          uVar10 = 0;
          do {
            Vec_IntPush(p,uVar10);
            uVar10 = uVar10 + 1;
          } while (uVar5 != uVar10);
          __ptr = p->pArray;
          if (uVar5 != 1) {
            uVar9 = 1;
            uVar7 = 0;
            do {
              uVar1 = uVar7 + 1;
              uVar12 = uVar7 & 0xffffffff;
              uVar11 = uVar9;
              do {
                iVar6 = __ptr[uVar11];
                if (((long)iVar6 < 0) || ((int)*(uint *)((long)pvVar3 + 0x1c) <= iVar6)) {
LAB_0084c204:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                uVar10 = __ptr[(int)uVar12];
                if (((long)(int)uVar10 < 0) || (*(uint *)((long)pvVar3 + 0x1c) <= uVar10))
                goto LAB_0084c204;
                uVar4 = uVar11 & 0xffffffff;
                if (*(int *)(*(long *)((long)pvVar3 + 0x20) + (long)(int)uVar10 * 4) <=
                    *(int *)(*(long *)((long)pvVar3 + 0x20) + (long)iVar6 * 4)) {
                  uVar4 = uVar12;
                }
                uVar12 = uVar4;
                uVar11 = uVar11 + 1;
              } while (uVar5 != uVar11);
              iVar6 = __ptr[uVar7];
              __ptr[uVar7] = __ptr[(int)uVar12];
              __ptr[(int)uVar12] = iVar6;
              uVar9 = uVar9 + 1;
              uVar7 = uVar1;
            } while (uVar1 != uVar5 - 1);
          }
        }
        iVar6 = Abc_SopGetCubeNum(pSop);
        lVar13 = (long)(int)uVar5 + 3;
        iVar6 = iVar6 * (int)lVar13;
        if (*__ptr_00 <= iVar6) {
          iVar6 = iVar6 + 1;
          if (local_68 == (char *)0x0) {
            local_68 = (char *)malloc((long)iVar6);
          }
          else {
            local_68 = (char *)realloc(local_68,(long)iVar6);
          }
          *(char **)(__ptr_00 + 2) = local_68;
          *__ptr_00 = iVar6;
        }
        iVar6 = Abc_SopGetCubeNum(pSop);
        memcpy(local_68,pSop,(long)(iVar6 * (int)lVar13 + 1));
        if (*local_68 != '\0') {
          __s = pSop;
          pcVar15 = local_68;
          do {
            if (0 < (int)uVar5) {
              memset(__s,0x2d,(ulong)uVar5);
              uVar7 = 0;
              do {
                if ((pcVar15[__ptr[uVar7]] & 0xfeU) == 0x30) {
                  __s[uVar7] = pcVar15[__ptr[uVar7]];
                }
                uVar7 = uVar7 + 1;
              } while (uVar5 != uVar7);
            }
            __s = __s + lVar13;
            pcVar2 = pcVar15 + lVar13;
            pcVar15 = pcVar15 + lVar13;
          } while (*pcVar2 != '\0');
        }
        *(char **)((long)pvVar3 + 0x38) = pSop;
        qsort(*(void **)((long)pvVar3 + 0x20),(long)*(int *)((long)pvVar3 + 0x1c),4,
              Vec_IntSortCompare1);
        pVVar8 = pNtk->vObjs;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar8->nSize);
    __ptr = p->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(p);
  if (local_68 != (char *)0x0) {
    free(local_68);
  }
  free(__ptr_00);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////
 
////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Reorder fanins of the network.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_NtkOrderFaninsById( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vOrder;
    Vec_Str_t * vStore;
    Abc_Obj_t * pNode;
    char * pSop, * pSopNew;
    char * pCube, * pCubeNew;
    int nVars, i, v, * pOrder;
    assert( Abc_NtkHasSop(pNtk) );
    vOrder = Vec_IntAlloc( 100 );
    vStore = Vec_StrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        pSop = (char *)pNode->pData;
        nVars = Abc_SopGetVarNum(pSop);
        assert( nVars == Abc_ObjFaninNum(pNode) );
        Vec_IntClear( vOrder );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vOrder, v );
        pOrder = Vec_IntArray(vOrder);
        Vec_IntSelectSortCost( pOrder, nVars, &pNode->vFanins );
        // copy the cover
        Vec_StrGrow( vStore, Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1 );
        memcpy( Vec_StrArray(vStore), pSop, (size_t)(Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1) );
        pSopNew = pCubeNew = pSop;
        pSop = Vec_StrArray(vStore);
        // generate permuted one
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            for ( v = 0; v < nVars; v++ )
                pCubeNew[v] = '-';
            for ( v = 0; v < nVars; v++ )
                if ( pCube[pOrder[v]] == '0' )
                    pCubeNew[v] = '0';
                else if ( pCube[pOrder[v]] == '1' )
                    pCubeNew[v] = '1';
            pCubeNew += nVars + 3;
        }
        pNode->pData = pSopNew;
        Vec_IntSort( &pNode->vFanins, 0 );
//        Vec_IntPrint( vOrder );
    }
    Vec_IntFree( vOrder );
    Vec_StrFree( vStore );
}